

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
          (CompilerGLSL *this,char (*t) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [3],
          char **ts_4,char (*ts_5) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,char (*ts_7) [8],
          char **ts_8,char (*ts_9) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_10,char (*ts_11) [2]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_12,
          char (*ts_13) [4],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_14
          ,char (*ts_15) [2],uint *ts_16,char (*ts_17) [4])

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12,ts_13,ts_14,
             ts_15,ts_16,ts_17);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}